

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O0

void CrossProduct(vertex_t a,vertex_t b,vertex_t c,vertex_t *n)

{
  float fVar1;
  GLfloat v3;
  GLfloat v2;
  GLfloat v1;
  GLfloat u3;
  GLfloat u2;
  GLfloat u1;
  vertex_t *n_local;
  float local_54;
  float fStack_50;
  vertex_t c_local;
  float local_38;
  float fStack_34;
  vertex_t b_local;
  float local_18;
  float fStack_14;
  vertex_t a_local;
  
  local_38 = b.x;
  local_18 = a.x;
  fStack_34 = b.y;
  fStack_14 = a.y;
  local_54 = c.x;
  fStack_50 = c.y;
  fVar1 = c.z - a.z;
  n->x = (fStack_34 - fStack_14) * fVar1 + -((fStack_50 - fStack_14) * fVar1);
  n->y = (fStack_34 - a.z) * (local_54 - local_18) + -(fVar1 * (local_38 - local_18));
  n->z = (local_38 - local_18) * (fStack_50 - fStack_14) +
         -((local_54 - local_18) * (fStack_34 - fStack_14));
  return;
}

Assistant:

void CrossProduct( vertex_t a, vertex_t b, vertex_t c, vertex_t *n )
{
   GLfloat u1, u2, u3;
   GLfloat v1, v2, v3;

   u1 = b.x - a.x;
   u2 = b.y - a.y;
   u3 = b.y - a.z;

   v1 = c.x - a.x;
   v2 = c.y - a.y;
   v3 = c.z - a.z;

   n->x = u2 * v3 - v2 * v3;
   n->y = u3 * v1 - v3 * u1;
   n->z = u1 * v2 - v1 * u2;
}